

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.cpp
# Opt level: O3

int __thiscall
GeneticAlgorithm::findMaxCacheNumber
          (GeneticAlgorithm *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parent)

{
  pointer pcVar1;
  pointer ppCVar2;
  long *plVar3;
  int iVar4;
  long lVar5;
  pointer pbVar6;
  long lVar7;
  int iVar8;
  vector<CacheServer_*,_std::allocator<CacheServer_*>_> caches;
  string gene;
  int local_7c;
  vector<CacheServer_*,_std::allocator<CacheServer_*>_> local_68;
  long *local_50 [2];
  long local_40 [2];
  
  pbVar6 = (parent->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  std::vector<CacheServer_*,_std::allocator<CacheServer_*>_>::vector
            (&local_68,&(this->dataCenter).caches);
  local_7c = 0;
  if ((long)(parent->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(parent->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start != 0x20) {
    local_7c = 0;
    iVar8 = -1;
    lVar7 = 1;
    do {
      local_50[0] = local_40;
      pcVar1 = (pbVar6->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pcVar1,pcVar1 + pbVar6->_M_string_length);
      plVar3 = local_50[0];
      ppCVar2 = local_68.super__Vector_base<CacheServer_*,_std::allocator<CacheServer_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (iVar8 == -1) {
        iVar8 = (int)local_68.super__Vector_base<CacheServer_*,_std::allocator<CacheServer_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[local_7c]->maxCapacity;
      }
      iVar4 = atoi((char *)local_50[0]);
      iVar4 = (this->dataCenter).videos.super__Vector_base<Video,_std::allocator<Video>_>._M_impl.
              super__Vector_impl_data._M_start[iVar4].size;
      if (iVar8 < iVar4) {
        lVar5 = (long)local_7c;
        local_7c = local_7c + 1;
        iVar8 = (int)ppCVar2[lVar5 + 1]->maxCapacity;
      }
      if (plVar3 != local_40) {
        operator_delete(plVar3,local_40[0] + 1);
      }
      iVar8 = iVar8 - iVar4;
      lVar7 = lVar7 + 1;
      pbVar6 = pbVar6 + 1;
    } while (lVar7 != (long)(parent->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(parent->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5);
  }
  if (local_68.super__Vector_base<CacheServer_*,_std::allocator<CacheServer_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<CacheServer_*,_std::allocator<CacheServer_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<CacheServer_*,_std::allocator<CacheServer_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<CacheServer_*,_std::allocator<CacheServer_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_7c;
}

Assistant:

int GeneticAlgorithm::findMaxCacheNumber(std::vector<std::string> parent) {
    int freeSpace1 = -1;
    int parent1Count = 0;
    int actualCache = 0;
    std::vector<std::string>::iterator parentIterator = parent.begin();
    std::vector<CacheServer *> caches = this->dataCenter.caches;
    for (;;) {
        if(parent1Count == parent.size() -1) break;
        std::string gene  = *parentIterator;
        CacheServer *cacheServer = caches[actualCache];
        if(freeSpace1 == -1) freeSpace1 = cacheServer->maxCapacity;
        Video video = dataCenter.videos[atoi(gene.c_str())];
        if(video.size <= freeSpace1){
            freeSpace1 = freeSpace1 - video.size;
        }
        else{
            actualCache++;
            cacheServer = caches[actualCache];
            freeSpace1 = cacheServer->maxCapacity ;
            freeSpace1 = freeSpace1 - video.size ;
        }
        parent1Count++;
        parentIterator++;
    }
    return actualCache;
}